

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int arith(lua_State *L,int op,char *mtname)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  
  iVar1 = tonum(L,1);
  if (iVar1 != 0) {
    iVar1 = tonum(L,2);
    if (iVar1 != 0) {
      lua_arith(L,op);
      return extraout_EAX;
    }
  }
  lua_settop(L,2);
  iVar1 = lua_type(L,2);
  if (iVar1 != 4) {
    iVar1 = luaL_getmetafield(L,2,mtname);
    if (iVar1 != 0) goto LAB_0011bae3;
  }
  arith_cold_1();
LAB_0011bae3:
  lua_rotate(L,-3,1);
  lua_callk(L,2,1,0,(lua_KFunction)0x0);
  return extraout_EAX_00;
}

Assistant:

static int arith (lua_State *L, int op, const char *mtname) {
  if (tonum(L, 1) && tonum(L, 2))
    lua_arith(L, op);  /* result will be on the top */
  else
    trymt(L, mtname);
  return 1;
}